

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

char * FBaseCVar::ToString(UCVarValue value,ECVarType type)

{
  ulong uVar1;
  
  switch(type) {
  case CVAR_Bool:
    uVar1 = (ulong)value.String & 1;
    value.String = falsestr;
    if (uVar1 != 0) {
      value.String = truestr;
    }
    break;
  case CVAR_Int:
    mysnprintf(cstrbuf,0x28,"%i",(ulong)value.String & 0xffffffff);
    goto LAB_004a7bc5;
  case CVAR_Float:
    mysnprintf(cstrbuf,0x28,"%H",(double)value.Float);
    value.String = cstrbuf;
    break;
  case CVAR_String:
    break;
  default:
    builtin_strncpy(cstrbuf,"<huh?>",7);
    return cstrbuf;
  case CVAR_GUID:
    FormatGUID(cstrbuf,0x28,value.pGUID);
LAB_004a7bc5:
    value.String = cstrbuf;
  }
  return value.String;
}

Assistant:

const char *FBaseCVar::ToString (UCVarValue value, ECVarType type)
{
	switch (type)
	{
	case CVAR_Bool:
		return value.Bool ? truestr : falsestr;

	case CVAR_String:
		return value.String;

	case CVAR_Int:
		mysnprintf (cstrbuf, countof(cstrbuf), "%i", value.Int);
		break;

	case CVAR_Float:
		IGNORE_FORMAT_PRE
		mysnprintf (cstrbuf, countof(cstrbuf), "%H", value.Float);
		IGNORE_FORMAT_POST
		break;

	case CVAR_GUID:
		FormatGUID (cstrbuf, countof(cstrbuf), *value.pGUID);
		break;

	default:
		strcpy (cstrbuf, "<huh?>");
		break;
	}
	return cstrbuf;
}